

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionAccept.cpp
# Opt level: O1

void __thiscall
ki::protocol::control::SessionAccept::read_from(SessionAccept *this,istream *istream)

{
  Field<int> *pFVar1;
  Field<unsigned_int> *pFVar2;
  Field<unsigned_short> *pFVar3;
  Record record;
  ostringstream oss;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  Record local_218 [6];
  
  ki::dml::Record::Record(local_218);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"unknown","");
  ki::dml::Record::add_field<unsigned_short>(local_218,&local_238,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"unknown2","");
  ki::dml::Record::add_field<unsigned_int>(local_218,&local_258,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"m_timestamp","");
  pFVar1 = ki::dml::Record::add_field<int>(local_218,&local_278,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"m_milliseconds","");
  pFVar2 = ki::dml::Record::add_field<unsigned_int>(local_218,&local_298,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"m_session_id","");
  pFVar3 = ki::dml::Record::add_field<unsigned_short>(local_218,&local_2b8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  ki::dml::Record::read_from(local_218,istream);
  this->m_timestamp = pFVar1->m_value;
  this->m_milliseconds = pFVar2->m_value;
  this->m_session_id = pFVar3->m_value;
  ki::dml::Record::~Record(local_218);
  return;
}

Assistant:

void SessionAccept::read_from(std::istream& istream)
	{
		dml::Record record;
		record.add_field<dml::USHRT>("unknown");
		record.add_field<dml::UINT>("unknown2");
		auto *timestamp = record.add_field<dml::INT>("m_timestamp");
		auto *milliseconds = record.add_field<dml::UINT>("m_milliseconds");
		auto *session_id = record.add_field<dml::USHRT>("m_session_id");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading SessionAccept payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_timestamp = timestamp->get_value();
		m_milliseconds = milliseconds->get_value();
		m_session_id = session_id->get_value();
	}